

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

int sat_solver_add_buffer(sat_solver *pSat,int iVarA,int iVarB,int fCompl)

{
  int iVar1;
  lit local_2c;
  int Cid;
  lit Lits [2];
  int fCompl_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver *pSat_local;
  
  Lits[0] = fCompl;
  Lits[1] = iVarB;
  if ((-1 < iVarA) && (-1 < iVarB)) {
    local_2c = toLitCond(iVarA,0);
    Cid = toLitCond(Lits[1],(uint)((Lits[0] != 0 ^ 0xffU) & 1));
    iVar1 = sat_solver_addclause(pSat,&local_2c,Lits);
    if (iVar1 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      if (iVar1 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0x171,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
      }
      local_2c = toLitCond(iVarA,1);
      Cid = toLitCond(Lits[1],Lits[0]);
      iVar1 = sat_solver_addclause(pSat,&local_2c,Lits);
      if (iVar1 == 0) {
        pSat_local._4_4_ = 0;
      }
      else {
        if (iVar1 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x178,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
        }
        pSat_local._4_4_ = 2;
      }
    }
    return pSat_local._4_4_;
  }
  __assert_fail("iVarA >= 0 && iVarB >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
}

Assistant:

static inline int sat_solver_add_buffer( sat_solver * pSat, int iVarA, int iVarB, int fCompl )
{
    lit Lits[2];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 );

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, !fCompl );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    if ( Cid == 0 )
        return 0;
    assert( Cid );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, fCompl );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 2 );
    if ( Cid == 0 )
        return 0;
    assert( Cid );
    return 2;
}